

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chain_pdf2
          (Impl *this,void *pNext,ScratchAllocator *alloc,void **out_pnext)

{
  VkStructureType VVar1;
  bool bVar2;
  LogLevel LVar3;
  VkPhysicalDeviceMeshShaderFeaturesEXT *create_info;
  void *pvVar4;
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *ci_9;
  VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *ci_8;
  VkPhysicalDeviceShaderObjectFeaturesEXT *ci_7;
  VkPhysicalDeviceDescriptorBufferFeaturesEXT *ci_6;
  VkPhysicalDeviceMeshShaderFeaturesEXT *ci_5;
  VkPhysicalDeviceMeshShaderFeaturesNV *ci_4;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *ci_3;
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *ci_2;
  VkPhysicalDeviceImageRobustnessFeaturesEXT *ci_1;
  VkPhysicalDeviceRobustness2FeaturesEXT *ci;
  VkBaseInStructure *pin;
  VkBaseInStructure **ppNext;
  VkBaseInStructure new_pnext;
  void **out_pnext_local;
  ScratchAllocator *alloc_local;
  void *pNext_local;
  Impl *this_local;
  
  new_pnext.pNext = (VkBaseInStructure *)out_pnext;
  memset(&ppNext,0,0x10);
  pin = &new_pnext;
  alloc_local = (ScratchAllocator *)pNext;
  do {
    create_info = (VkPhysicalDeviceMeshShaderFeaturesEXT *)
                  pnext_chain_pdf2_skip_ignored_entries(alloc_local);
    if (create_info == (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0) {
      (new_pnext.pNext)->sType = new_pnext.sType;
      *(undefined4 *)&(new_pnext.pNext)->field_0x4 = new_pnext._4_4_;
      return true;
    }
    VVar1 = create_info->sType;
    if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV) {
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDeviceMeshShaderFeaturesNV>
                         (this,(VkPhysicalDeviceMeshShaderFeaturesNV *)create_info,alloc);
      *(void **)pin = pvVar4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR) {
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>
                         (this,(VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)create_info,alloc);
      *(void **)pin = pvVar4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT) {
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDeviceRobustness2FeaturesEXT>
                         (this,(VkPhysicalDeviceRobustness2FeaturesEXT *)create_info,alloc);
      *(void **)pin = pvVar4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT) {
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDeviceDescriptorBufferFeaturesEXT>
                         (this,(VkPhysicalDeviceDescriptorBufferFeaturesEXT *)create_info,alloc);
      *(void **)pin = pvVar4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV) {
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV>
                         (this,(VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *)create_info,
                          alloc);
      *(void **)pin = pvVar4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT) {
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDeviceMeshShaderFeaturesEXT>
                         (this,create_info,alloc);
      *(void **)pin = pvVar4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES) {
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDeviceImageRobustnessFeatures>
                         (this,(VkPhysicalDeviceImageRobustnessFeatures *)create_info,alloc);
      *(void **)pin = pvVar4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT) {
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT>
                         (this,(VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *)create_info,
                          alloc);
      *(void **)pin = pvVar4;
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT) {
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>
                         (this,(VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)create_info,alloc);
      *(void **)pin = pvVar4;
    }
    else {
      if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT) {
        LVar3 = get_thread_log_level();
        if (((int)LVar3 < 3) &&
           (bVar2 = Internal::log_thread_callback
                              (LOG_ERROR,"Cannot copy unknown pNext sType: %d.\n",
                               (ulong)create_info->sType), !bVar2)) {
          fprintf(_stderr,"Fossilize ERROR: Cannot copy unknown pNext sType: %d.\n",
                  (ulong)create_info->sType);
        }
        return false;
      }
      pvVar4 = copy_pnext_struct_simple<VkPhysicalDeviceShaderObjectFeaturesEXT>
                         (this,(VkPhysicalDeviceShaderObjectFeaturesEXT *)create_info,alloc);
      *(void **)pin = pvVar4;
    }
    alloc_local = (ScratchAllocator *)create_info->pNext;
    pin = (VkBaseInStructure *)(*(long *)pin + 8);
    *(undefined8 *)pin = 0;
  } while( true );
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chain_pdf2(const void *pNext, ScratchAllocator &alloc, void **out_pnext)
{
	VkBaseInStructure new_pnext = {};
	const VkBaseInStructure **ppNext = &new_pnext.pNext;

	while ((pNext = pnext_chain_pdf2_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceRobustness2FeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceImageRobustnessFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		{
			auto *ci = static_cast<const VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		{
			auto *ci = static_cast<const VkPhysicalDeviceFragmentShadingRateFeaturesKHR *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		{
			auto *ci = static_cast<const VkPhysicalDeviceMeshShaderFeaturesNV *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceMeshShaderFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceDescriptorBufferFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceShaderObjectFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
		{
			auto *ci = static_cast<const VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *>(pNext);
			*ppNext = static_cast<VkBaseInStructure *>(copy_pnext_struct_simple(ci, alloc));
			break;
		}

		default:
			LOGE_LEVEL("Cannot copy unknown pNext sType: %d.\n", int(pin->sType));
			return false;
		}

		pNext = pin->pNext;
		ppNext = const_cast<const VkBaseInStructure **>(&(*ppNext)->pNext);
		*ppNext = nullptr;
	}

	*out_pnext = (void *)new_pnext.pNext;
	return true;
}